

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::LoadIniSettingsFromMemory(char *ini_data,size_t ini_size)

{
  int *piVar1;
  char *pcVar2;
  char cVar3;
  code *pcVar4;
  ImGuiContext *pIVar5;
  char *__dest;
  char *pcVar6;
  undefined1 *puVar7;
  void *pvVar8;
  ImGuiSettingsHandler *pIVar9;
  void *pvVar10;
  char *pcVar11;
  char *pcVar12;
  ImGuiContext *ctx;
  int iVar13;
  long lVar14;
  char *pcVar15;
  int iVar16;
  long lVar17;
  
  pIVar5 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0x281e,"void ImGui::LoadIniSettingsFromMemory(const char *, size_t)");
  }
  if (ini_size == 0) {
    ini_size = strlen(ini_data);
  }
  iVar13 = (int)ini_size + 1;
  iVar16 = (pIVar5->SettingsIniData).Buf.Capacity;
  if ((int)ini_size < iVar16) {
    __dest = (pIVar5->SettingsIniData).Buf.Data;
  }
  else {
    if (iVar16 == 0) {
      iVar16 = 8;
    }
    else {
      iVar16 = iVar16 / 2 + iVar16;
    }
    if (iVar16 <= iVar13) {
      iVar16 = iVar13;
    }
    piVar1 = &(pIVar5->IO).MetricsActiveAllocations;
    *piVar1 = *piVar1 + 1;
    __dest = (char *)(*GImAllocatorAllocFunc)((long)iVar16,GImAllocatorUserData);
    pcVar2 = (pIVar5->SettingsIniData).Buf.Data;
    if (pcVar2 != (char *)0x0) {
      memcpy(__dest,pcVar2,(long)(pIVar5->SettingsIniData).Buf.Size);
      pcVar2 = (pIVar5->SettingsIniData).Buf.Data;
      if ((pcVar2 != (char *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + -1;
      }
      (*GImAllocatorFreeFunc)(pcVar2,GImAllocatorUserData);
    }
    (pIVar5->SettingsIniData).Buf.Data = __dest;
    (pIVar5->SettingsIniData).Buf.Capacity = iVar16;
  }
  (pIVar5->SettingsIniData).Buf.Size = iVar13;
  memcpy(__dest,ini_data,ini_size);
  __dest[ini_size] = '\0';
  iVar16 = (pIVar5->SettingsHandlers).Size;
  if (0 < iVar16) {
    lVar14 = 0;
    lVar17 = 0;
    do {
      pIVar9 = (pIVar5->SettingsHandlers).Data;
      pcVar4 = *(code **)((long)&pIVar9->ReadInitFn + lVar14);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(pIVar5,(long)&pIVar9->TypeName + lVar14);
        iVar16 = (pIVar5->SettingsHandlers).Size;
      }
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + 0x48;
    } while (lVar17 < iVar16);
  }
  if (0 < (long)ini_size) {
    pcVar2 = __dest + ini_size;
    pvVar10 = (void *)0x0;
    pIVar9 = (ImGuiSettingsHandler *)0x0;
    pcVar15 = __dest;
    do {
      pcVar6 = pcVar15 + 2;
      pcVar11 = pcVar15;
      while( true ) {
        pcVar11 = pcVar11 + 1;
        cVar3 = *pcVar15;
        if ((cVar3 != '\n') && (cVar3 != '\r')) break;
        pcVar15 = pcVar15 + 1;
        pcVar6 = pcVar6 + 1;
      }
      pcVar12 = pcVar15;
      if (pcVar15 < pcVar2) {
        while ((cVar3 != '\n' && (cVar3 != '\r'))) {
          pcVar12 = pcVar11;
          if (pcVar2 <= pcVar11) goto LAB_001606ef;
          cVar3 = *pcVar11;
          pcVar11 = pcVar11 + 1;
        }
        pcVar12 = pcVar11 + -1;
      }
LAB_001606ef:
      *pcVar12 = '\0';
      if (*pcVar15 != ';') {
        if (((*pcVar15 == '[') && (pcVar15 < pcVar12)) && (pcVar12[-1] == ']')) {
          pcVar12[-1] = '\0';
          puVar7 = (undefined1 *)memchr(pcVar15 + 1,0x5d,(long)pcVar12 - (long)pcVar6);
          if ((puVar7 != (undefined1 *)0x0) &&
             (pvVar8 = memchr(puVar7 + 1,0x5b,(size_t)(pcVar12 + (-1 - (long)(puVar7 + 1)))),
             pvVar8 != (void *)0x0)) {
            *puVar7 = 0;
            pIVar9 = FindSettingsHandler(pcVar15 + 1);
            if (pIVar9 == (ImGuiSettingsHandler *)0x0) {
              pIVar9 = (ImGuiSettingsHandler *)0x0;
              pvVar10 = (void *)0x0;
            }
            else {
              pvVar10 = (*pIVar9->ReadOpenFn)(pIVar5,pIVar9,(char *)((long)pvVar8 + 1));
            }
          }
        }
        else if ((pIVar9 != (ImGuiSettingsHandler *)0x0) && (pvVar10 != (void *)0x0)) {
          (*pIVar9->ReadLineFn)(pIVar5,pIVar9,pvVar10,pcVar15);
        }
      }
      pcVar15 = pcVar12 + 1;
    } while (pcVar15 < pcVar2);
  }
  pIVar5->SettingsLoaded = true;
  memcpy(__dest,ini_data,ini_size);
  iVar16 = (pIVar5->SettingsHandlers).Size;
  if (0 < iVar16) {
    lVar14 = 0;
    lVar17 = 0;
    do {
      pIVar9 = (pIVar5->SettingsHandlers).Data;
      pcVar4 = *(code **)((long)&pIVar9->ApplyAllFn + lVar14);
      if (pcVar4 != (code *)0x0) {
        (*pcVar4)(pIVar5,(long)&pIVar9->TypeName + lVar14);
        iVar16 = (pIVar5->SettingsHandlers).Size;
      }
      lVar17 = lVar17 + 1;
      lVar14 = lVar14 + 0x48;
    } while (lVar17 < iVar16);
  }
  return;
}

Assistant:

void ImGui::LoadIniSettingsFromMemory(const char* ini_data, size_t ini_size)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);
    //IM_ASSERT(!g.WithinFrameScope && "Cannot be called between NewFrame() and EndFrame()");
    //IM_ASSERT(g.SettingsLoaded == false && g.FrameCount == 0);

    // For user convenience, we allow passing a non zero-terminated string (hence the ini_size parameter).
    // For our convenience and to make the code simpler, we'll also write zero-terminators within the buffer. So let's create a writable copy..
    if (ini_size == 0)
        ini_size = strlen(ini_data);
    g.SettingsIniData.Buf.resize((int)ini_size + 1);
    char* const buf = g.SettingsIniData.Buf.Data;
    char* const buf_end = buf + ini_size;
    memcpy(buf, ini_data, ini_size);
    buf_end[0] = 0;

    // Call pre-read handlers
    // Some types will clear their data (e.g. dock information) some types will allow merge/override (window)
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ReadInitFn)
            g.SettingsHandlers[handler_n].ReadInitFn(&g, &g.SettingsHandlers[handler_n]);

    void* entry_data = NULL;
    ImGuiSettingsHandler* entry_handler = NULL;

    char* line_end = NULL;
    for (char* line = buf; line < buf_end; line = line_end + 1)
    {
        // Skip new lines markers, then find end of the line
        while (*line == '\n' || *line == '\r')
            line++;
        line_end = line;
        while (line_end < buf_end && *line_end != '\n' && *line_end != '\r')
            line_end++;
        line_end[0] = 0;
        if (line[0] == ';')
            continue;
        if (line[0] == '[' && line_end > line && line_end[-1] == ']')
        {
            // Parse "[Type][Name]". Note that 'Name' can itself contains [] characters, which is acceptable with the current format and parsing code.
            line_end[-1] = 0;
            const char* name_end = line_end - 1;
            const char* type_start = line + 1;
            char* type_end = (char*)(void*)ImStrchrRange(type_start, name_end, ']');
            const char* name_start = type_end ? ImStrchrRange(type_end + 1, name_end, '[') : NULL;
            if (!type_end || !name_start)
                continue;
            *type_end = 0; // Overwrite first ']'
            name_start++;  // Skip second '['
            entry_handler = FindSettingsHandler(type_start);
            entry_data = entry_handler ? entry_handler->ReadOpenFn(&g, entry_handler, name_start) : NULL;
        }
        else if (entry_handler != NULL && entry_data != NULL)
        {
            // Let type handler parse the line
            entry_handler->ReadLineFn(&g, entry_handler, entry_data, line);
        }
    }
    g.SettingsLoaded = true;

    // [DEBUG] Restore untouched copy so it can be browsed in Metrics (not strictly necessary)
    memcpy(buf, ini_data, ini_size);

    // Call post-read handlers
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
        if (g.SettingsHandlers[handler_n].ApplyAllFn)
            g.SettingsHandlers[handler_n].ApplyAllFn(&g, &g.SettingsHandlers[handler_n]);
}